

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall Js::EntryPointInfo::Reset(EntryPointInfo *this,bool resetStateToNotScheduled)

{
  code *pcVar1;
  State SVar2;
  bool bVar3;
  undefined4 *puVar4;
  NativeEntryPointData **ppNVar5;
  NativeEntryPointData *this_00;
  ScriptContext *scriptContext;
  nullptr_t local_28;
  nullptr_t local_20;
  byte local_11;
  EntryPointInfo *pEStack_10;
  bool resetStateToNotScheduled_local;
  EntryPointInfo *this_local;
  
  local_11 = resetStateToNotScheduled;
  pEStack_10 = this;
  SVar2 = GetState(this);
  if (SVar2 == CleanedUp) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x2356,"(this->GetState() != CleanedUp)",
                                "this->GetState() != CleanedUp");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  local_20 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<CodeGenWorkItem>::operator=(&this->workItem,&local_20);
  ppNVar5 = Memory::WriteBarrierPtr::operator_cast_to_NativeEntryPointData__
                      ((WriteBarrierPtr *)&this->nativeEntryPointData);
  if (*ppNVar5 != (NativeEntryPointData *)0x0) {
    this_00 = Memory::WriteBarrierPtr<NativeEntryPointData>::operator->(&this->nativeEntryPointData)
    ;
    scriptContext = GetScriptContext(this);
    NativeEntryPointData::Cleanup(this_00,scriptContext,false,true);
    local_28 = (nullptr_t)0x0;
    Memory::WriteBarrierPtr<NativeEntryPointData>::operator=(&this->nativeEntryPointData,&local_28);
  }
  if ((local_11 & 1) != 0) {
    this->state = NotScheduled;
  }
  return;
}

Assistant:

void EntryPointInfo::Reset(bool resetStateToNotScheduled)
    {
        Assert(this->GetState() != CleanedUp);
        this->workItem = nullptr;
#if ENABLE_NATIVE_CODEGEN
        if (this->nativeEntryPointData)
        {
            this->nativeEntryPointData->Cleanup(GetScriptContext(), false, true);
            this->nativeEntryPointData = nullptr;
        }
#endif
        // Set the state to NotScheduled only if the call to Reset is not because of JIT cap being reached
        if (resetStateToNotScheduled)
        {
            this->state = NotScheduled;
        }
    }